

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

int deranged_enum(int n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  if (n < 0) {
    iVar2 = 0;
  }
  else if ((uint)n < 3) {
    iVar2 = *(int *)(&DAT_002195a0 + (ulong)(uint)n * 4);
  }
  else {
    iVar1 = 1;
    iVar4 = 2;
    iVar3 = 0;
    while (iVar2 = iVar1, iVar4 + 1 <= n) {
      iVar1 = iVar4 * (iVar3 + iVar2);
      iVar4 = iVar4 + 1;
      iVar3 = iVar2;
    }
  }
  return iVar2;
}

Assistant:

int deranged_enum ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    DERANGED_ENUM returns the number of derangements of N objects.
//
//  Discussion:
//
//    A derangement of N objects is a permutation with no fixed
//    points.  If we symbolize the permutation operation by "P",
//    then for a derangment, P(I) is never equal to I.
//
//  Recursion:
//
//      D(0) = 1
//      D(1) = 0
//      D(2) = 1
//      D(N) = (N-1) * ( D(N-1) + D(N-2) )
//
//    or
//
//      D(0) = 1
//      D(1) = 0
//      D(N) = N * D(N-1) + (-1)^N
//
//    D(N) = N! * ( 1 - 1/1! + 1/2! - 1/3! ... 1/N! )
//
//    Based on the inclusion/exclusion law.
//
//    D(N) is the number of ways of placing N non-attacking rooks on
//    an N by N chessboard with one diagonal deleted.
//
//    Limit ( N -> Infinity ) D(N)/N! = 1 / e.
//
//    The number of permutations with exactly K items in the right
//    place is COMB(N,K) * D(N-K).
//
//  First values:
//
//     N         D(N)
//     0           1
//     1           0
//     2           1
//     3           2
//     4           9
//     5          44
//     6         265
//     7        1854
//     8       14833
//     9      133496
//    10     1334961
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    13 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of objects to be permuted.
//
//    Output, int DERANGED_ENUM, the number of derangements of N objects.
//
{
  int dn;
  int dnm1;
  int dnm2;
  int i;

  if ( n < 0 )
  {
    dn = 0;
  }
  else if ( n == 0 )
  {
    dn = 1;
  }
  else if ( n == 1 )
  {
    dn = 0;
  }
  else if ( n == 2 )
  {
    dn = 1;
  }
  else
  {
    dnm1 = 0;
    dn = 1;

    for ( i = 3; i <= n; i++ )
    {
      dnm2 = dnm1;
      dnm1 = dn;
      dn = ( i - 1 ) * ( dnm1 + dnm2 );
    }

  }

  return dn;
}